

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O1

Error asmjit::v1_14::VirtMem::mapMemory
                (void **p,size_t size,MemoryFlags memoryFlags,int fd,off_t offset)

{
  long lVar1;
  MemoryFlags __prot;
  bool bVar2;
  Error EVar3;
  void *__addr;
  int *piVar4;
  __atomic_base<unsigned_long> _Var5;
  MemoryFlags MVar6;
  int __flags;
  
  *p = (void *)0x0;
  if (size == 0) {
    EVar3 = 2;
  }
  else {
    MVar6 = kAccessRW;
    if ((memoryFlags & kAccessWrite) == kNone) {
      MVar6 = memoryFlags & kAccessRead;
    }
    __prot = MVar6 | kAccessRX;
    if ((memoryFlags & kAccessExecute) == kNone) {
      __prot = MVar6;
    }
    __flags = (uint)((memoryFlags >> 8 & 1) == 0) + (uint)(fd == -1) * 0x20 + 1;
    if ((memoryFlags >> 9 & 1) != 0) {
      _Var5 = largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i;
      if ((ulong)largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i < 2) {
        if (largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i == 1) {
          _Var5._M_i = 0;
        }
        else {
          _Var5._M_i = detectLargePageSize();
          largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(_Var5._M_i + (_Var5._M_i == 0));
          LOCK();
          UNLOCK();
        }
      }
      if (_Var5._M_i == 0) {
        EVar3 = 7;
        bVar2 = false;
      }
      else {
        bVar2 = false;
        if (size % _Var5._M_i == 0) {
          lVar1 = 0;
          if (_Var5._M_i != 0) {
            for (; (_Var5._M_i >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          EVar3 = (int)lVar1 * 0x4000000;
          __flags = __flags + EVar3 + 0x40000;
          bVar2 = true;
        }
        else {
          EVar3 = 2;
        }
      }
      if (!bVar2) {
        return EVar3;
      }
    }
    __addr = mmap((void *)0x0,size,__prot,__flags,fd,0);
    if (__addr == (void *)0xffffffffffffffff) {
      piVar4 = __errno_location();
      EVar3 = asmjitErrorFromErrno(*piVar4);
      return EVar3;
    }
    if ((memoryFlags >> 9 & 1) != 0) {
      madvise(__addr,size,0xe);
    }
    *p = __addr;
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

static Error mapMemory(void** p, size_t size, MemoryFlags memoryFlags, int fd = -1, off_t offset = 0) noexcept {
  *p = nullptr;
  if (size == 0)
    return DebugUtils::errored(kErrorInvalidArgument);

  int protection = mmProtFromMemoryFlags(memoryFlags) | mmMaxProtFromMemoryFlags(memoryFlags);
  int mmFlags = mmMapJitFromMemoryFlags(memoryFlags);

  mmFlags |= Support::test(memoryFlags, MemoryFlags::kMapShared) ? MAP_SHARED : MAP_PRIVATE;
  if (fd == -1)
    mmFlags |= MAP_ANONYMOUS;

  bool useLargePages = Support::test(memoryFlags, VirtMem::MemoryFlags::kMMapLargePages);

  if (useLargePages) {
#if defined(__linux__)
    size_t lpSize = largePageSize();
    if (lpSize == 0)
      return DebugUtils::errored(kErrorFeatureNotEnabled);

    if (!Support::isAligned(size, lpSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    unsigned lpSizeLog2 = Support::ctz(lpSize);
    mmFlags |= int(unsigned(MAP_HUGETLB) | (lpSizeLog2 << MAP_HUGE_SHIFT));
#else
    return DebugUtils::errored(kErrorFeatureNotEnabled);
#endif // __linux__
  }

  void* ptr = mmap(nullptr, size, protection, mmFlags, fd, offset);
  if (ptr == MAP_FAILED)
    return DebugUtils::errored(asmjitErrorFromErrno(errno));

#if defined(MADV_HUGEPAGE)
  if (useLargePages) {
    madvise(ptr, size, MADV_HUGEPAGE);
  }
#endif

  *p = ptr;
  return kErrorOk;
}